

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

PatternBlock * __thiscall PatternBlock::intersect(PatternBlock *this,PatternBlock *b)

{
  bool bVar1;
  int4 iVar2;
  int4 iVar3;
  PatternBlock *pPVar4;
  uintm local_80;
  uint local_5c;
  uint local_58;
  uintm resval;
  uintm resmask;
  uintm commonmask;
  uintm val2;
  uintm mask2;
  uintm val1;
  uintm mask1;
  int4 offset;
  int4 maxlength;
  PatternBlock *res;
  PatternBlock *local_20;
  PatternBlock *b_local;
  PatternBlock *this_local;
  
  local_20 = b;
  b_local = this;
  bVar1 = alwaysFalse(this);
  if ((!bVar1) && (bVar1 = alwaysFalse(local_20), !bVar1)) {
    pPVar4 = (PatternBlock *)operator_new(0x38);
    PatternBlock(pPVar4,true);
    _offset = pPVar4;
    iVar2 = getLength(this);
    iVar3 = getLength(local_20);
    if (iVar3 < iVar2) {
      local_80 = getLength(this);
    }
    else {
      local_80 = getLength(local_20);
    }
    mask1 = local_80;
    _offset->offset = 0;
    val1 = 0;
    while( true ) {
      if ((int)mask1 <= (int)val1) {
        _offset->nonzerosize = mask1;
        normalize(_offset);
        return _offset;
      }
      mask2 = getMask(this,val1 << 3,0x20);
      val2 = getValue(this,val1 << 3,0x20);
      commonmask = getMask(local_20,val1 << 3,0x20);
      resmask = getValue(local_20,val1 << 3,0x20);
      resval = mask2 & commonmask;
      if ((resval & val2) != (resval & resmask)) break;
      local_58 = mask2 | commonmask;
      local_5c = mask2 & val2 | commonmask & resmask;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&_offset->maskvec,&local_58);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&_offset->valvec,&local_5c);
      val1 = val1 + 4;
    }
    _offset->nonzerosize = -1;
    normalize(_offset);
    return _offset;
  }
  pPVar4 = (PatternBlock *)operator_new(0x38);
  PatternBlock(pPVar4,false);
  return pPVar4;
}

Assistant:

PatternBlock *PatternBlock::intersect(const PatternBlock *b) const

{ // Construct the intersecting pattern
  if (alwaysFalse() || b->alwaysFalse())
    return new PatternBlock(false);
  PatternBlock *res = new PatternBlock(true);
  int4 maxlength = (getLength() > b->getLength()) ? getLength() : b->getLength();

  res->offset = 0;
  int4 offset = 0;
  uintm mask1,val1,mask2,val2,commonmask;
  uintm resmask,resval;
  while(offset < maxlength) {
    mask1 = getMask(offset*8,sizeof(uintm)*8);
    val1 = getValue(offset*8,sizeof(uintm)*8);
    mask2 = b->getMask(offset*8,sizeof(uintm)*8);
    val2 = b->getValue(offset*8,sizeof(uintm)*8);
    commonmask = mask1 & mask2;	// Bits in mask shared by both patterns
    if ((commonmask & val1) != (commonmask & val2)) {
      res->nonzerosize = -1;	// Impossible pattern
      res->normalize();
      return res;
    }
    resmask = mask1 | mask2;
    resval = (mask1 & val1) | (mask2 & val2);
    res->maskvec.push_back(resmask);
    res->valvec.push_back(resval);
    offset += sizeof(uintm);
  }
  res->nonzerosize = maxlength;
  res->normalize();
  return res;
}